

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_3c9;
  string local_3c8;
  TPZGeoBlend<pzgeom::TPZGeoLinear> local_3a8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"TPZGeoElRefLess",&local_3c9);
  uVar1 = Hash(&local_3c8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&local_3a8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::ClassId(&local_3a8);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::~TPZGeoBlend(&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}